

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::Write(ON_Font *this,ON_BinaryArchive *file)

{
  ON_wString OVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Member local_82;
  byte local_81;
  undefined1 local_80 [6];
  uchar quartet_member_as_unsigned;
  bool bFontNamesSaved;
  undefined1 local_75;
  undefined4 local_74;
  undefined1 local_70 [3];
  bool bOBSOLETEBool;
  undefined1 local_68 [16];
  ON_wString obsolete_font_description;
  undefined1 local_40 [16];
  uint fc;
  bool rc;
  ON_wString local_28;
  ON_wString local_20;
  ON_BinaryArchive *file_local;
  ON_Font *this_local;
  
  local_20.m_s = (wchar_t *)file;
  file_local = (ON_BinaryArchive *)this;
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if ((iVar3 < 0x3c) ||
     (uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion((ON_BinaryArchive *)local_20.m_s),
     uVar4 < ON_TextStyle::binary_archive_opennurbs_version)) {
    ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                 ,0x2906,"","This font should probably be an ON_TextStyle.");
    uVar4 = RuntimeSerialNumber(this);
    _fc = (wchar_t *)0;
    local_28.m_s = (wchar_t *)(uchar  [8])0x0;
    this_local._7_1_ =
         WriteV5(this,uVar4,(ON_UUID)ZEXT816((ulong)0),(ON_BinaryArchive *)local_20.m_s);
  }
  else {
    bVar2 = ON_BinaryArchive::BeginWrite3dmChunk((ON_BinaryArchive *)local_20.m_s,0x40008000,1,6);
    if (bVar2) {
      local_40[0xf] = 0;
      local_40._8_4_ = FontCharacteristicsAsUnsigned(this);
      bVar2 = ON_BinaryArchive::WriteInt((ON_BinaryArchive *)local_20.m_s,local_40._8_4_);
      OVar1.m_s = local_20.m_s;
      if (bVar2) {
        WindowsLogfontName((ON_Font *)local_40);
        bVar2 = ON_BinaryArchive::WriteWideString
                          ((ON_BinaryArchive *)OVar1.m_s,(ON_wString *)local_40);
        ON_wString::~ON_wString((ON_wString *)local_40);
        OVar1.m_s = local_20.m_s;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          PostScriptName((ON_Font *)&obsolete_font_description);
          bVar2 = ON_BinaryArchive::WriteString
                            ((ON_BinaryArchive *)OVar1.m_s,&obsolete_font_description);
          ON_wString::~ON_wString(&obsolete_font_description);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            PostScriptName((ON_Font *)(local_68 + 8));
            bVar2 = ON_wString::IsEmpty((ON_wString *)(local_68 + 8));
            if (bVar2) {
              FamilyName((ON_Font *)local_68);
              ON_wString::operator=((ON_wString *)(local_68 + 8),(ON_wString *)local_68);
              ON_wString::~ON_wString((ON_wString *)local_68);
            }
            bVar2 = ON_wString::IsEmpty((ON_wString *)(local_68 + 8));
            if (bVar2) {
              WindowsLogfontName((ON_Font *)local_70);
              ON_wString::operator=((ON_wString *)(local_68 + 8),(ON_wString *)local_70);
              ON_wString::~ON_wString((ON_wString *)local_70);
            }
            bVar2 = ON_BinaryArchive::WriteString
                              ((ON_BinaryArchive *)local_20.m_s,(ON_wString *)(local_68 + 8));
            if ((((bVar2) &&
                 (bVar2 = ON_BinaryArchive::WriteInt
                                    ((ON_BinaryArchive *)local_20.m_s,this->m_windows_logfont_weight
                                    ), bVar2)) &&
                (bVar2 = ON_BinaryArchive::WriteDouble
                                   ((ON_BinaryArchive *)local_20.m_s,this->m_apple_font_weight_trait
                                   ), bVar2)) &&
               (bVar2 = ON_BinaryArchive::WriteDouble
                                  ((ON_BinaryArchive *)local_20.m_s,this->m_point_size), bVar2)) {
              local_75 = 0;
              bVar2 = ON_BinaryArchive::WriteBool((ON_BinaryArchive *)local_20.m_s,false);
              OVar1.m_s = local_20.m_s;
              if (bVar2) {
                FamilyName((ON_Font *)local_80);
                bVar2 = ON_BinaryArchive::WriteString
                                  ((ON_BinaryArchive *)OVar1.m_s,(ON_wString *)local_80);
                ON_wString::~ON_wString((ON_wString *)local_80);
                if ((((bVar2 ^ 0xffU) & 1) == 0) &&
                   (bVar2 = ON_BinaryArchive::WriteString
                                      ((ON_BinaryArchive *)local_20.m_s,&this->m_locale_name), bVar2
                   )) {
                  local_81 = 0;
                  bVar2 = ON_BinaryArchive::WriteString
                                    ((ON_BinaryArchive *)local_20.m_s,&this->m_loc_postscript_name);
                  if (((bVar2) &&
                      ((bVar2 = ON_BinaryArchive::WriteString
                                          ((ON_BinaryArchive *)local_20.m_s,
                                           &this->m_en_postscript_name), bVar2 &&
                       (bVar2 = ON_BinaryArchive::WriteString
                                          ((ON_BinaryArchive *)local_20.m_s,
                                           &this->m_loc_windows_logfont_name), bVar2)))) &&
                     ((bVar2 = ON_BinaryArchive::WriteString
                                         ((ON_BinaryArchive *)local_20.m_s,
                                          &this->m_en_windows_logfont_name), bVar2 &&
                      ((((bVar2 = ON_BinaryArchive::WriteString
                                            ((ON_BinaryArchive *)local_20.m_s,
                                             &this->m_loc_family_name), bVar2 &&
                         (bVar2 = ON_BinaryArchive::WriteString
                                            ((ON_BinaryArchive *)local_20.m_s,
                                             &this->m_en_family_name), bVar2)) &&
                        (bVar2 = ON_BinaryArchive::WriteString
                                           ((ON_BinaryArchive *)local_20.m_s,&this->m_loc_face_name)
                        , bVar2)) &&
                       (bVar2 = ON_BinaryArchive::WriteString
                                          ((ON_BinaryArchive *)local_20.m_s,&this->m_en_face_name),
                       bVar2)))))) {
                    local_81 = 1;
                  }
                  if (((local_81 & 1) != 0) &&
                     (bVar2 = ON_PANOSE1::Write(&this->m_panose1,(ON_BinaryArchive *)local_20.m_s),
                     bVar2)) {
                    local_82 = this->m_quartet_member;
                    bVar2 = ON_BinaryArchive::WriteByte
                                      ((ON_BinaryArchive *)local_20.m_s,1,&local_82);
                    if (bVar2) {
                      local_40[0xf] = 1;
                    }
                  }
                }
              }
            }
            local_74 = 2;
            ON_wString::~ON_wString((ON_wString *)(local_68 + 8));
          }
        }
      }
      bVar2 = ON_BinaryArchive::EndWrite3dmChunk((ON_BinaryArchive *)local_20.m_s);
      if (!bVar2) {
        local_40[0xf] = 0;
      }
      this_local._7_1_ = (bool)(local_40[0xf] & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Font::Write(
  ON_BinaryArchive& file // serialize definition to binary archive
  ) const
{

  if (file.Archive3dmVersion() < 60 
    || file.ArchiveOpenNURBSVersion() < ON_TextStyle::binary_archive_opennurbs_version
    )
  {
    ON_WARNING("This font should probably be an ON_TextStyle.");
    return WriteV5(
      RuntimeSerialNumber(),
      ON_nil_uuid,
      file
      );
  }


  if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,6))
    return false;

  bool rc = false;
  for (;;)
  {
    // version 1.0
    unsigned int fc = FontCharacteristicsAsUnsigned();
    if (!file.WriteInt(fc))
      break;

    // Windows LOGFONT.lfFaceName
    if ( !file.WriteWideString(WindowsLogfontName()) )
      break;

    // PostScript name
    if (!file.WriteString(PostScriptName()))
      break;

    // version 1.1 added font_description August 2016
    ON_wString obsolete_font_description = PostScriptName();
    if (obsolete_font_description.IsEmpty())
      obsolete_font_description = FamilyName();
    if (obsolete_font_description.IsEmpty())
      obsolete_font_description = WindowsLogfontName();
    if (!file.WriteString(obsolete_font_description))
      break;

    // version 1.2 added m_windows_logfont_weight and m_apple_font_weight_trait
    if (!file.WriteInt(m_windows_logfont_weight))
      break;

    if (!file.WriteDouble(m_apple_font_weight_trait))
      break;

    // version 1.3 added additional m_point_size and m_LOGFONT_* values.
    if (!file.WriteDouble(m_point_size))
      break;

    const bool bOBSOLETEBool = false;
    if (!file.WriteBool(bOBSOLETEBool))
      break;
    
    // version 1.4 explicit Family name
    if (!file.WriteString(FamilyName()))
      break;

    // version 1.5 explicit names in loc and en and PANOSE1 settings
    if (!file.WriteString(m_locale_name))
      break;

    bool bFontNamesSaved = false;
    for(;;)
    {
      // NEVER commit code with this define set.
      //
      // This code is used by developers to create files used to test
      // code and UI for handing situations when a font is not installed
      // on a device.
      //
      // To create a missing font test .3dm file, you must modify code 
      // int opennurbs_font.cpp and in opennurbs_text.cpp. 
      // Search for CREATE_MISSING_FONT_TEST_3DM_FILE to find the locations.
//#define CREATE_MISSING_FONT_TEST_3DM_FILE
#if defined(CREATE_MISSING_FONT_TEST_3DM_FILE)
      // All fonts in the Family with MISSING_FONT_TEST_valid_family_name 
      // will be saved as a family named missing_family_name.
      const ON_wString MISSING_FONT_TEST_valid_font_family_name(L"Courier New");
      if (MISSING_FONT_TEST_valid_font_family_name == FamilyName() && FaceName().IsNotEmpty())
      {
        // Write Missing Font names
        const ON_wString missing_font_family_name(L"Missing Font Test");
        const ON_wString missing_font_face_name(FaceName());
        const ON_wString missing_font_logfont_name(missing_font_family_name);
        ON_wString missing_font_postscript_name = missing_font_family_name + L"-" + missing_font_face_name;
        missing_font_postscript_name.Remove(ON_wString::Space);
        // local and english postscript name
        if (!file.WriteString(missing_font_postscript_name))
          break;
        if (!file.WriteString(missing_font_postscript_name))
          break;
        // local and english logfont name
        if (!file.WriteString(missing_font_logfont_name))
          break;
        if (!file.WriteString(missing_font_logfont_name))
          break;
        // local and english family name
        if (!file.WriteString(missing_font_family_name))
          break;
        if (!file.WriteString(missing_font_family_name))
          break;
        // local and english face name
        if (!file.WriteString(missing_font_face_name))
          break;
        if (!file.WriteString(missing_font_face_name))
          break;

        bFontNamesSaved = true;
        break;
      }
#endif

      // write correct names
      if (!file.WriteString(m_loc_postscript_name))
        break;
      if (!file.WriteString(m_en_postscript_name))
        break;
      if (!file.WriteString(m_loc_windows_logfont_name))
        break;
      if (!file.WriteString(m_en_windows_logfont_name))
        break;
      if (!file.WriteString(m_loc_family_name))
        break;
      if (!file.WriteString(m_en_family_name))
        break;
      if (!file.WriteString(m_loc_face_name))
        break;
      if (!file.WriteString(m_en_face_name))
        break;

      bFontNamesSaved = true;
      break;
    }

    if (false == bFontNamesSaved)
      break; // errors writing font names


    if (!m_panose1.Write(file))
      break;

    // version 1.6 rich text quartet member (regular/bold/italic/bold-italic)
    const unsigned char quartet_member_as_unsigned = static_cast<unsigned char>(this->m_quartet_member);
    if (!file.WriteByte(1,&quartet_member_as_unsigned))
      break;

    rc = true;
    break;
  }

  if (!file.EndWrite3dmChunk())
    rc = false;

  return rc;
}